

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O3

void __thiscall imgtogb::StdOutput::StdOutput(StdOutput *this,string *basename,string *author)

{
  pointer pcVar1;
  
  (this->super_CmdLineOutput)._vptr_CmdLineOutput = (_func_int **)&PTR__StdOutput_00156808;
  (this->basename)._M_dataplus._M_p = (pointer)&(this->basename).field_2;
  pcVar1 = (basename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->basename,pcVar1,pcVar1 + basename->_M_string_length);
  (this->author)._M_dataplus._M_p = (pointer)&(this->author).field_2;
  pcVar1 = (author->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->author,pcVar1,pcVar1 + author->_M_string_length);
  return;
}

Assistant:

StdOutput(const std::string &basename, const std::string &author)
			: basename(basename)
			, author(author)
			{ }